

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swift_generator.cc
# Opt level: O3

string * grpc_swift_generator::anon_unknown_0::WrapInNameSpace
                   (string *__return_storage_ptr__,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *components,string *name)

{
  pointer pcVar1;
  string *extraout_RAX;
  string *psVar2;
  pointer pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string qualified_name;
  long *local_80 [2];
  long local_70 [2];
  undefined1 local_60 [32];
  string *local_40;
  string *local_38;
  
  local_60._0_8_ = local_60 + 0x10;
  local_60._8_8_ = 0;
  local_60[0x10] = '\0';
  pbVar3 = (components->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_40 = __return_storage_ptr__;
  local_38 = name;
  if (pbVar3 != (components->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      pcVar1 = (pbVar3->_M_dataplus)._M_p;
      local_80[0] = local_70;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_80,pcVar1,pcVar1 + pbVar3->_M_string_length);
      std::__cxx11::string::append((char *)local_80);
      std::__cxx11::string::_M_append(local_60,(ulong)local_80[0]);
      if (local_80[0] != local_70) {
        operator_delete(local_80[0],local_70[0] + 1);
      }
      pbVar3 = pbVar3 + 1;
    } while (pbVar3 != (components->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  std::operator+(local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_60,local_38);
  psVar2 = (string *)(local_60 + 0x10);
  if ((string *)local_60._0_8_ != psVar2) {
    operator_delete((void *)local_60._0_8_,CONCAT71(local_60._17_7_,local_60[0x10]) + 1);
    psVar2 = extraout_RAX;
  }
  return psVar2;
}

Assistant:

static std::string WrapInNameSpace(const std::vector<std::string> &components,
                            const grpc::string &name) {
  std::string qualified_name;
  for (auto it = components.begin(); it != components.end(); ++it)
    qualified_name += *it + "_";
  return qualified_name + name;
}